

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  int in_ESI;
  float in_XMM1_Da;
  ImRect IVar1;
  ImRect rect;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float x1;
  undefined1 auVar2 [12];
  ImRect *this;
  ImRect local_10;
  
  IVar1 = ImGuiWindow::Rect((ImGuiWindow *)0x1473f3);
  auVar2 = IVar1._0_12_;
  if ((in_XMM1_Da == 0.0) && (!NAN(in_XMM1_Da))) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,1.0,1.0);
    operator-=((ImVec2 *)&stack0xffffffffffffffd4,(ImVec2 *)&stack0xffffffffffffffc4);
  }
  x1 = auVar2._0_4_;
  this = auVar2._4_8_;
  if (in_ESI == 0) {
    ImRect::ImRect(this,x1,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0);
  }
  else if (in_ESI == 1) {
    ImRect::ImRect(this,x1,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0);
  }
  else if (in_ESI == 2) {
    ImRect::ImRect(this,x1,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0);
  }
  else if (in_ESI == 3) {
    ImRect::ImRect(this,x1,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffc0);
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return local_10;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1, 1);
    if (border_n == 0) { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    } // Top
    if (border_n == 1) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); } // Right
    if (border_n == 2) { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    } // Bottom
    if (border_n == 3) { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); } // Left
    IM_ASSERT(0);
    return ImRect();
}